

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

_Bool Is_There_Room_For_A_Char_In_Line(FORM *form)

{
  byte bVar1;
  
  wmove(form->w,form->currow,form->current->dcols + -1);
  bVar1 = winch(form->w);
  wmove(form->w,form->currow,form->curcol);
  return bVar1 == 0x20 || (uint)bVar1 == form->current->pad;
}

Assistant:

INLINE static bool Is_There_Room_For_A_Char_In_Line(FORM * form)
{
  int last_char_in_line;

  wmove(form->w,form->currow,form->current->dcols-1);
  last_char_in_line  = (int)(winch(form->w) & A_CHARTEXT);
  wmove(form->w,form->currow,form->curcol);
  return (((last_char_in_line == form->current->pad) ||
           is_blank(last_char_in_line)) ? TRUE : FALSE);
}